

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singlylinkedlist.c
# Opt level: O1

LIST_ITEM_HANDLE singlylinkedlist_add_head(SINGLYLINKEDLIST_HANDLE list,void *item)

{
  LIST_ITEM_HANDLE pLVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (list == (SINGLYLINKEDLIST_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (LIST_ITEM_HANDLE)0x0;
    }
    pcVar4 = "Invalid argument SINGLYLINKEDLIST_HANDLE list=%p";
    iVar3 = 0x17f;
  }
  else {
    pLVar1 = (LIST_ITEM_HANDLE)malloc(0x10);
    if (pLVar1 != (LIST_ITEM_HANDLE)0x0) {
      pLVar1->item = item;
      if (list->head == (LIST_ITEM_INSTANCE *)0x0) {
        pLVar1->next = (void *)0x0;
        list->head = pLVar1;
        list->tail = pLVar1;
        return pLVar1;
      }
      pLVar1->next = list->head;
      list->head = pLVar1;
      return pLVar1;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (LIST_ITEM_HANDLE)0x0;
    }
    pcVar4 = "failure in malloc";
    iVar3 = 0x189;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/singlylinkedlist.c"
            ,"singlylinkedlist_add_head",iVar3,1,pcVar4);
  return (LIST_ITEM_HANDLE)0x0;
}

Assistant:

LIST_ITEM_HANDLE singlylinkedlist_add_head(SINGLYLINKEDLIST_HANDLE list, const void* item)
{
    LIST_ITEM_HANDLE result;

    /* Codes_SRS_LIST_02_001: [ If list is NULL then singlylinkedlist_add_head shall fail and return NULL. ]*/
    if (list == NULL)
    {
        LogError("Invalid argument SINGLYLINKEDLIST_HANDLE list=%p", list);
        result = NULL;
    }
    else
    {
        result = malloc(sizeof(LIST_ITEM_INSTANCE));

        if (result == NULL)
        {
            /*Codes_SRS_LIST_02_003: [ If there are any failures then singlylinkedlist_add_head shall fail and return NULL. ]*/
            LogError("failure in malloc");
            /*return as is*/
        }
        else
        {
            /*Codes_SRS_LIST_02_002: [ singlylinkedlist_add_head shall insert item at head, succeed and return a non-NULL value. ]*/
            result->item = item;
            if (list->head == NULL)
            {
                result->next = NULL;
                list->head = result;
                list->tail = result;
                
            }
            else
            {
                result->next = list->head;
                list->head = result;
            }
        }
    }

    return result;
}